

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadPoses(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  uint16_t uVar2;
  Pose *this_00;
  string local_58;
  Pose *local_28;
  Pose *pose;
  Mesh *pMStack_18;
  uint16_t id;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    pose._6_2_ = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && pose._6_2_ == 0xc100) {
      this_00 = (Pose *)operator_new(0x58);
      Pose::Pose(this_00);
      local_28 = this_00;
      ReadLine_abi_cxx11_(&local_58,this);
      std::__cxx11::string::operator=((string *)local_28,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      uVar2 = Read<unsigned_short>(this);
      local_28->target = uVar2;
      bVar1 = Read<bool>(this);
      local_28->hasNormals = bVar1;
      ReadPoseVertices(this,local_28);
      std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>::push_back
                (&pMStack_18->poses,&local_28);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        pose._6_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadPoses(Mesh *mesh)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_POSE)
        {
            Pose *pose = new Pose();
            pose->name = ReadLine();
            pose->target = Read<uint16_t>();
            pose->hasNormals = Read<bool>();

            ReadPoseVertices(pose);

            mesh->poses.push_back(pose);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}